

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceExamples.cpp
# Opt level: O2

void writeRgba3(char *fileName,Rgba *pixels,int width,int height,char *comments,
               M44f *cameraTransform)

{
  int iVar1;
  allocator<char> local_d1;
  RgbaOutputFile file;
  half hStack_ce;
  half hStack_cc;
  half hStack_ca;
  string local_88 [32];
  Header header;
  
  _file = 0;
  hStack_ce._h = 0;
  hStack_cc._h = 0;
  hStack_ca._h = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,&header,width,height,&file,0,3);
  std::__cxx11::string::string<std::allocator<char>>(local_88,comments,&local_d1);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)&file);
  Imf_3_4::Header::insert((char *)&header,(Attribute *)"comments");
  Imf_3_4::TypedAttribute<std::__cxx11::string>::~TypedAttribute
            ((TypedAttribute<std::__cxx11::string> *)&file);
  std::__cxx11::string::~string(local_88);
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::TypedAttribute((Matrix44 *)&file);
  Imf_3_4::Header::insert((char *)&header,(Attribute *)"cameraTransform");
  Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>::~TypedAttribute
            ((TypedAttribute<Imath_3_2::Matrix44<float>> *)&file);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile(&file,fileName,&header,WRITE_RGBA,iVar1);
  Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)&file);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&file);
  Imf_3_4::Header::~Header(&header);
  return;
}

Assistant:

void
writeRgba3 (
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height,
    const char  comments[],
    const M44f& cameraTransform)
{
    //
    // Write an RGBA image using class RgbaOutputFile.
    // Store two extra attributes in the image header:
    // a string and a 4x4 transformation matrix.
    //
    //	- open the file
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    Header header (width, height);
    header.insert ("comments", StringAttribute (comments));
    header.insert ("cameraTransform", M44fAttribute (cameraTransform));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}